

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O0

void __thiscall
AVO::Simulator::setAgentDefaults
          (Simulator *this,float neighborDist,size_t maxNeighbors,float timeHorizon,float radius,
          float maxSpeed,float maxAccel,float accelInterval,Vector2 *velocity)

{
  void *pvVar1;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM5_Da;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (*in_RDI == 0) {
    pvVar1 = operator_new(200);
    Agent::Agent((Agent *)CONCAT44(in_XMM5_Da,in_stack_ffffffffffffffd0));
    *in_RDI = (long)pvVar1;
  }
  *(undefined4 *)(*in_RDI + 0x30) = in_XMM5_Da;
  *(undefined4 *)(*in_RDI + 0x34) = in_XMM4_Da;
  *(undefined8 *)(*in_RDI + 0x28) = in_RSI;
  *(undefined4 *)(*in_RDI + 0x38) = in_XMM3_Da;
  *(undefined4 *)(*in_RDI + 0x3c) = in_XMM0_Da;
  *(undefined4 *)(*in_RDI + 0x40) = in_XMM2_Da;
  *(undefined4 *)(*in_RDI + 0x44) = in_XMM1_Da;
  *(undefined8 *)(*in_RDI + 0x18) = *in_RDX;
  return;
}

Assistant:

void Simulator::setAgentDefaults(float neighborDist, std::size_t maxNeighbors,
                                 float timeHorizon, float radius,
                                 float maxSpeed, float maxAccel,
                                 float accelInterval, const Vector2 &velocity) {
  if (defaultAgent_ == NULL) {
    defaultAgent_ = new Agent();
  }

  assert(accelInterval >= 0.0F);
  defaultAgent_->accelInterval_ = accelInterval;
  assert(maxAccel >= 0.0F);
  defaultAgent_->maxAccel_ = maxAccel;
  defaultAgent_->maxNeighbors_ = maxNeighbors;
  assert(maxSpeed >= 0.0F);
  defaultAgent_->maxSpeed_ = maxSpeed;
  assert(neighborDist >= 0.0F);
  defaultAgent_->neighborDist_ = neighborDist;
  assert(radius >= 0.0F);
  defaultAgent_->radius_ = radius;
  assert(timeHorizon >= 0.0F);
  defaultAgent_->timeHorizon_ = timeHorizon;
  defaultAgent_->velocity_ = velocity;
}